

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SEES_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::SEES_PDU::SetPropulsionSystem
          (SEES_PDU *this,
          vector<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>
          *PS)

{
  KUINT16 *pKVar1;
  uint uVar2;
  
  pKVar1 = &(this->super_Header).super_Header6.m_ui16PDULength;
  *pKVar1 = *pKVar1 - ((ushort)((uint)(*(int *)&(this->m_vPropSys).
                                                super__Vector_base<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                      *(int *)&(this->m_vPropSys).
                                               super__Vector_base<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 1) &
                      0xfff8);
  std::vector<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>
  ::operator=(&this->m_vPropSys,PS);
  uVar2 = (uint)(*(int *)&(this->m_vPropSys).
                          super__Vector_base<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                *(int *)&(this->m_vPropSys).
                         super__Vector_base<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4;
  this->m_ui16NumPropulsionSys = (KUINT16)uVar2;
  pKVar1 = &(this->super_Header).super_Header6.m_ui16PDULength;
  *pKVar1 = *pKVar1 + (short)(uVar2 << 3);
  return;
}

Assistant:

void SEES_PDU::SetPropulsionSystem( const vector<PropulsionSystem> & PS )
{
    m_ui16PDULength -= PropulsionSystem::PROPULSION_SYSTEM_SIZE * m_vPropSys.size();
    m_vPropSys = PS;
    m_ui16NumPropulsionSys = m_vPropSys.size();
    m_ui16PDULength += m_vPropSys.size() * PropulsionSystem::PROPULSION_SYSTEM_SIZE;
}